

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O2

Trick * Trick::unserialize(json *data)

{
  bool bVar1;
  int iVar2;
  Trick *this;
  reference this_00;
  const_reference pvVar3;
  Card *c;
  iterator __end1;
  iterator __begin1;
  
  this = (Trick *)operator_new(0x20);
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_serialize_abi_cxx11__0011cb40;
  (this->_cards).super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_cards;
  (this->_cards).super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_cards;
  (this->_cards).super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>.
  _M_impl._M_node._M_size = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&__begin1,data);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&__end1,data);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=(&__begin1,&__end1);
    if (!bVar1) break;
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&__begin1);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,1);
    iVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<int,_int,_0>(pvVar3);
    c = Card::get(iVar2);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,0);
    iVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<int,_int,_0>(pvVar3);
    addCard(this,c,iVar2);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(&__begin1);
  }
  return this;
}

Assistant:

Trick *Trick::unserialize(json data) {
    Trick *t = new Trick;

    for (const auto &c: data) {
        t->addCard(Card::get(c[1]), c[0]);
    }

    return t;
}